

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O3

void onig_st_free_table(st_table *table)

{
  st_table_entry *psVar1;
  int iVar2;
  st_table_entry *__ptr;
  long lVar3;
  
  iVar2 = table->num_bins;
  if (0 < iVar2) {
    lVar3 = 0;
    do {
      __ptr = table->bins[lVar3];
      if (table->bins[lVar3] != (st_table_entry *)0x0) {
        do {
          psVar1 = __ptr->next;
          free(__ptr);
          __ptr = psVar1;
        } while (psVar1 != (st_table_entry *)0x0);
        iVar2 = table->num_bins;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar2);
  }
  free(table->bins);
  free(table);
  return;
}

Assistant:

extern void
st_free_table(st_table* table)
{
  register st_table_entry *ptr, *next;
  int i;

  for(i = 0; i < table->num_bins; i++) {
    ptr = table->bins[i];
    while (ptr != 0) {
	    next = ptr->next;
	    free(ptr);
	    ptr = next;
    }
  }
  free(table->bins);
  free(table);
}